

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvaxtpoke.c
# Opt level: O0

void xt_wr32(int cnum,uint32_t addr,uint32_t val)

{
  uint32_t uVar1;
  uint32_t val_local;
  uint32_t addr_local;
  int cnum_local;
  
  nva_wr32(cnum,0x700004,addr);
  nva_wr32(cnum,0x700008,val);
  nva_wr32(cnum,0x70000,1);
  do {
    uVar1 = nva_rd32(cnum,0x70000);
  } while (uVar1 != 0);
  nva_wr32(cnum,0x700000,2);
  do {
    uVar1 = nva_rd32(cnum,0x700000);
  } while (uVar1 != 0);
  return;
}

Assistant:

void xt_wr32(int cnum, uint32_t addr, uint32_t val) {
	nva_wr32(cnum, 0x700004, addr);
	nva_wr32(cnum, 0x700008, val);
	nva_wr32(cnum, 0x70000, 1);
	while (nva_rd32(cnum, 0x70000));
	nva_wr32(cnum, 0x700000, 2);
	while (nva_rd32(cnum, 0x700000));
}